

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int open_set_incoming_locales(OPEN_HANDLE open,AMQP_VALUE incoming_locales_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (open == (OPEN_HANDLE)0x0) {
    iVar2 = 0x6fe;
  }
  else {
    if (incoming_locales_value == (AMQP_VALUE)0x0) {
      item_value = (AMQP_VALUE)0x0;
    }
    else {
      item_value = amqpvalue_clone(incoming_locales_value);
    }
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x70e;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(open->composite_value,6,item_value);
      iVar2 = 0x714;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int open_set_incoming_locales(OPEN_HANDLE open, AMQP_VALUE incoming_locales_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        AMQP_VALUE incoming_locales_amqp_value;
        if (incoming_locales_value == NULL)
        {
            incoming_locales_amqp_value = NULL;
        }
        else
        {
            incoming_locales_amqp_value = amqpvalue_clone(incoming_locales_value);
        }
        if (incoming_locales_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(open_instance->composite_value, 6, incoming_locales_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(incoming_locales_amqp_value);
        }
    }

    return result;
}